

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O1

void __thiscall
cmParseCoberturaCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  char *pcVar1;
  cmCTest *pcVar2;
  pointer pbVar3;
  pointer pcVar4;
  iterator __position;
  XMLParser *pXVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  long lVar11;
  long *plVar12;
  ostream *poVar13;
  mapped_type *pmVar14;
  _func_int **pp_Var15;
  _func_int **pp_Var16;
  pointer pbVar17;
  char **ppcVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string filename;
  string finalpath;
  string FoundSource;
  string line;
  ifstream fin;
  key_type *local_448;
  XMLParser *local_440;
  long *local_438 [2];
  long local_428 [2];
  pointer local_418;
  long *local_410;
  long local_408;
  long local_400 [2];
  string local_3f0;
  undefined1 *local_3d0;
  undefined8 local_3c8;
  undefined1 local_3c0;
  undefined7 uStack_3bf;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [6];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  _func_int *local_228;
  long lStack_220;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_3d0 = &local_3c0;
  local_3c8 = 0;
  local_3c0 = 0;
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3f0._M_string_length = 0;
  local_3f0.field_2._M_local_buf[0] = '\0';
  iVar7 = std::__cxx11::string::compare((char *)name);
  if (iVar7 == 0) {
    this->InSource = true;
    goto LAB_00186906;
  }
  iVar7 = std::__cxx11::string::compare((char *)name);
  if (iVar7 == 0) {
    this->InSources = true;
    goto LAB_00186906;
  }
  iVar7 = std::__cxx11::string::compare((char *)name);
  local_440 = this;
  if (iVar7 != 0) {
    iVar7 = std::__cxx11::string::compare((char *)name);
    if ((iVar7 == 0) && (local_440->SkipThisClass == false)) {
      ppcVar18 = atts + 1;
      iVar7 = -1;
      uVar9 = 0xffffffff;
      while( true ) {
        pcVar1 = ppcVar18[-1];
        iVar8 = strcmp(pcVar1,"hits");
        if (iVar8 == 0) {
          iVar7 = atoi(*ppcVar18);
        }
        else {
          iVar8 = strcmp(pcVar1,"number");
          if (iVar8 == 0) {
            uVar9 = atoi(*ppcVar18);
          }
        }
        if (0 < (int)uVar9 && -1 < iVar7) break;
        ppcVar18 = ppcVar18 + 1;
      }
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&local_440->Coverage->TotalCoverage,&local_440->CurFileName);
      (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[(ulong)uVar9 - 1] = iVar7;
    }
    goto LAB_00186906;
  }
  do {
    iVar7 = strcmp(*atts,"filename");
    atts = atts + 1;
  } while (iVar7 != 0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Reading file: ",0xe);
  pcVar1 = *atts;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)(_func_int *)
                         ((long)&local_448 + (long)*(_func_int **)(local_238._0_8_ + -0x18)) + 0x210
                   );
  }
  else {
    sVar10 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,pcVar1,sVar10);
  }
  std::ios::widen((char)(ostream *)local_238 + (char)*(_func_int **)(local_238._0_8_ + -0x18));
  std::ostream::put((char)local_238);
  std::ostream::flush();
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
               ,0x3d,(char *)local_3b0._0_8_,this->Coverage->Quiet);
  if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
    operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base(local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,*atts,(allocator<char> *)local_238);
  local_448 = &this->CurFileName;
  (this->CurFileName)._M_string_length = 0;
  *(this->CurFileName)._M_dataplus._M_p = '\0';
  pbVar17 = (this->FilePaths).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->FilePaths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar17 != pbVar3) {
    do {
      lVar11 = std::__cxx11::string::find((char *)&local_410,(ulong)(pbVar17->_M_dataplus)._M_p,0);
      if (lVar11 == 0) {
        std::__cxx11::string::_M_assign((string *)local_448);
        break;
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar3);
  }
  if ((this->CurFileName)._M_string_length == 0) {
    pbVar17 = (local_440->FilePaths).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_418 = (local_440->FilePaths).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar17 != local_418) {
      do {
        while( true ) {
          local_3b0._0_8_ = local_3b0 + 0x10;
          pcVar4 = (pbVar17->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3b0,pcVar4,pcVar4 + pbVar17->_M_string_length);
          std::__cxx11::string::append((char *)local_3b0);
          plVar12 = (long *)std::__cxx11::string::_M_append((char *)local_3b0,(ulong)local_410);
          pp_Var16 = (_func_int **)(plVar12 + 2);
          if ((_func_int **)*plVar12 == pp_Var16) {
            local_228 = *pp_Var16;
            lStack_220 = plVar12[3];
            local_238._0_8_ = &local_228;
          }
          else {
            local_228 = *pp_Var16;
            local_238._0_8_ = (_func_int **)*plVar12;
          }
          local_238._8_8_ = plVar12[1];
          *plVar12 = (long)pp_Var16;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_3f0,(string *)local_238);
          if ((_func_int **)local_238._0_8_ != &local_228) {
            operator_delete((void *)local_238._0_8_,(ulong)(local_228 + 1));
          }
          if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
            operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1))
            ;
          }
          bVar6 = cmsys::SystemTools::FileExists(&local_3f0);
          if (!bVar6) break;
          std::__cxx11::string::_M_assign((string *)local_448);
          pbVar17 = pbVar17 + 1;
          if (bVar6 || pbVar17 == local_418) goto LAB_00186481;
        }
        pbVar17 = pbVar17 + 1;
      } while (pbVar17 != local_418);
    }
  }
LAB_00186481:
  std::ifstream::ifstream(local_238,(local_448->_M_dataplus)._M_p,_S_in);
  pXVar5 = local_440;
  pp_Var16 = (_func_int **)(local_3b0 + 0x10);
  if (((local_440->CurFileName)._M_string_length == 0) ||
     ((abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 5) != 0)) {
    pcVar4 = (local_440->Coverage->BinaryDir)._M_dataplus._M_p;
    local_438[0] = local_428;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_438,pcVar4,pcVar4 + (local_440->Coverage->BinaryDir)._M_string_length
              );
    std::__cxx11::string::append((char *)local_438);
    plVar12 = (long *)std::__cxx11::string::append((char *)local_438);
    pp_Var15 = (_func_int **)(plVar12 + 2);
    if ((_func_int **)*plVar12 == pp_Var15) {
      local_3a0[0]._0_8_ = *pp_Var15;
      local_3a0[0]._8_8_ = plVar12[3];
      local_3b0._0_8_ = pp_Var16;
    }
    else {
      local_3a0[0]._0_8_ = *pp_Var15;
      local_3b0._0_8_ = (_func_int **)*plVar12;
    }
    local_3b0._8_8_ = plVar12[1];
    *plVar12 = (long)pp_Var15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_448,(string *)local_3b0);
    if ((_func_int **)local_3b0._0_8_ != pp_Var16) {
      operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1));
    }
    if (local_438[0] != local_428) {
      operator_delete(local_438[0],local_428[0] + 1);
    }
    std::ifstream::open(local_238,(_Ios_Openmode)(local_448->_M_dataplus)._M_p);
    if ((abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 5) == 0) goto LAB_00186813;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Skipping system file ",0x15);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,(char *)local_410,local_408);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    pcVar2 = pXVar5->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
                 ,0x5f,(char *)local_438[0],pXVar5->Coverage->Quiet);
    if (local_438[0] != local_428) {
      operator_delete(local_438[0],local_428[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
    pXVar5->SkipThisClass = true;
  }
  else {
LAB_00186813:
    local_3b0._8_8_ = 0;
    local_3a0[0]._M_allocated_capacity = local_3a0[0]._M_allocated_capacity & 0xffffffffffffff00;
    local_3b0._0_8_ = pp_Var16;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&pXVar5->Coverage->TotalCoverage,local_448);
    while (bVar6 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)local_238,(string *)local_3b0,(bool *)0x0,-1), bVar6) {
      local_438[0] = (long *)CONCAT44(local_438[0]._4_4_,0xffffffff);
      __position._M_current =
           (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (pmVar14,__position,(int *)local_438);
      }
      else {
        *__position._M_current = -1;
        (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
    }
    if ((_func_int **)local_3b0._0_8_ != pp_Var16) {
      operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0[0]._M_allocated_capacity + 1));
    }
  }
  std::ifstream::~ifstream(local_238);
  if (local_410 != local_400) {
    operator_delete(local_410,local_400[0] + 1);
  }
LAB_00186906:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                             local_3f0.field_2._M_local_buf[0]) + 1);
  }
  if (local_3d0 != &local_3c0) {
    operator_delete(local_3d0,CONCAT71(uStack_3bf,local_3c0) + 1);
  }
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) override
  {
    std::string FoundSource;
    std::string finalpath;
    if (name == "source") {
      this->InSource = true;
    } else if (name == "sources") {
      this->InSources = true;
    } else if (name == "class") {
      int tagCount = 0;
      while (true) {
        if (strcmp(atts[tagCount], "filename") == 0) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Reading file: " << atts[tagCount + 1]
                                              << std::endl,
                             this->Coverage.Quiet);
          std::string filename = atts[tagCount + 1];
          this->CurFileName.clear();

          // Check if this is an absolute path that falls within our
          // source or binary directories.
          for (std::string const& filePath : FilePaths) {
            if (filename.find(filePath) == 0) {
              this->CurFileName = filename;
              break;
            }
          }

          if (this->CurFileName.empty()) {
            // Check if this is a path that is relative to our source or
            // binary directories.
            for (std::string const& filePath : FilePaths) {
              finalpath = filePath + "/" + filename;
              if (cmSystemTools::FileExists(finalpath)) {
                this->CurFileName = finalpath;
                break;
              }
            }
          }

          cmsys::ifstream fin(this->CurFileName.c_str());
          if (this->CurFileName.empty() || !fin) {
            this->CurFileName =
              this->Coverage.BinaryDir + "/" + atts[tagCount + 1];
            fin.open(this->CurFileName.c_str());
            if (!fin) {
              cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                                 "Skipping system file " << filename
                                                         << std::endl,
                                 this->Coverage.Quiet);

              this->SkipThisClass = true;
              break;
            }
          }
          std::string line;
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          while (cmSystemTools::GetLineFromStream(fin, line)) {
            curFileLines.push_back(-1);
          }

          break;
        }
        ++tagCount;
      }
    } else if (name == "line") {
      int tagCount = 0;
      int curNumber = -1;
      int curHits = -1;
      while (true) {
        if (this->SkipThisClass) {
          break;
        }
        if (strcmp(atts[tagCount], "hits") == 0) {
          curHits = atoi(atts[tagCount + 1]);
        } else if (strcmp(atts[tagCount], "number") == 0) {
          curNumber = atoi(atts[tagCount + 1]);
        }

        if (curHits > -1 && curNumber > 0) {
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          {
            curFileLines[curNumber - 1] = curHits;
          }
          break;
        }
        ++tagCount;
      }
    }
  }